

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

wally_psbt * cfd::core::ParsePsbtData(ByteData *data)

{
  bool bVar1;
  pointer pTVar2;
  int iVar3;
  uint32_t uVar4;
  CfdException *pCVar5;
  wally_tx *pwVar6;
  size_t key_len;
  wally_psbt_output *output;
  uint index;
  ulong uVar7;
  wally_psbt *pwVar8;
  int ret;
  wally_psbt *psbt;
  uint8_t magic [5];
  allocator local_1e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  size_t tmp_size;
  void *pvStack_150;
  pointer local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  undefined1 local_100 [8];
  int local_f8;
  char *local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  wally_tx tx;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txouts;
  Deserializer parser;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  
  psbt = (wally_psbt *)0x0;
  ByteData::GetBytes(&bytes,data);
  ret = wally_psbt_from_bytes
                  (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,&psbt);
  pwVar8 = psbt;
  if (ret != -2) {
    if (ret != 0) {
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(tmp_buf.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish._4_4_,0x650);
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
      logger::warn<int&>((CfdSourceLocation *)&tmp_buf,"wally_psbt_from_bytes NG[{}]",&ret);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tmp_buf,"psbt from bytes error.",(allocator *)&tmp_size);
      CfdException::CfdException(pCVar5,kCfdInternalError,(string *)&tmp_buf);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    iVar3 = 0;
    if ((psbt->num_inputs != 0) || (psbt->num_outputs != 0)) goto LAB_002dc218;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tmp_buf,
               (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start,(allocator_type *)&tmp_size);
    tmp_size = 0;
    ret = wally_psbt_to_bytes(psbt,0,tmp_buf.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                              (long)tmp_buf.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)tmp_buf.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,&tmp_size);
    if ((ret == 0) &&
       (tmp_size ==
        (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start)) {
      bVar1 = false;
      pwVar8 = psbt;
    }
    else {
      wally_psbt_free(psbt);
      psbt = (wally_psbt *)0x0;
      bVar1 = true;
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    iVar3 = ret;
    if (!bVar1) goto LAB_002dc218;
  }
  Deserializer::Deserializer(&parser,data);
  magic[4] = '\0';
  magic[0] = '\0';
  magic[1] = '\0';
  magic[2] = '\0';
  magic[3] = '\0';
  if (5 < (ulong)((long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    Deserializer::ReadArray(&parser,magic,5);
  }
  iVar3 = bcmp(magic,ParsePsbtData::kPsbtMagic,5);
  if (iVar3 != 0) {
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x659);
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
    logger::warn<>((CfdSourceLocation *)&tmp_buf,"psbt unmatch magic.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tmp_buf,"psbt unmatch magic error.",(allocator *)&tmp_size);
    CfdException::CfdException(pCVar5,kCfdInternalError,(string *)&tmp_buf);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = wally_psbt_init_alloc(0,0,0,0,&psbt);
  if (ret != 0) {
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x65e);
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
    logger::warn<int&>((CfdSourceLocation *)&tmp_buf,"wally_psbt_init_alloc NG[{}]",&ret);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&tmp_buf,"psbt alloc error.",(allocator *)&tmp_size);
    CfdException::CfdException(pCVar5,kCfdInternalError,(string *)&tmp_buf);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  psbt->magic[4] = magic[4];
  *(undefined4 *)psbt->magic = magic._0_4_;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ret = 0;
  do {
    Deserializer::ReadVariableBuffer(&tmp_buf,&parser);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tmp_buf);
    if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    Deserializer::ReadVariableBuffer(&buf,&parser);
    key_len = (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    if (*key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == 0xfb) {
      if (key_len != 1) {
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(tmp_buf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,0x698);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
        logger::warn<>((CfdSourceLocation *)&tmp_buf,"psbt invalid key format.");
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&tmp_buf,"psbt invalid key format error.",(allocator *)&tmp_size);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (psbt->version != 0) {
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(tmp_buf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,0x69d);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
        logger::warn<>((CfdSourceLocation *)&tmp_buf,"psbt version duplicates.");
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&tmp_buf,"psbt version duplicates error.",(allocator *)&tmp_size);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if ((long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 4) {
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(tmp_buf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,0x6a2);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
        logger::warn<>((CfdSourceLocation *)&tmp_buf,"psbt invlid version size.");
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&tmp_buf,"psbt invlid version size error.",(allocator *)&tmp_size);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      uVar4 = *(uint32_t *)
               buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      psbt->version = uVar4;
      if (uVar4 != 0) {
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(tmp_buf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,0x6a9);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
        logger::warn<unsigned_int&>
                  ((CfdSourceLocation *)&tmp_buf,"psbt unsupported version[{}]",&psbt->version);
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&tmp_buf,"psbt unsupported version error.",(allocator *)&tmp_size);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else if (*key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == '\0') {
      if (key_len != 1) {
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(tmp_buf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,0x66d);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
        logger::warn<>((CfdSourceLocation *)&tmp_buf,"psbt invalid key format.");
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&tmp_buf,"psbt invalid key format error.",(allocator *)&tmp_size);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (psbt->tx != (wally_tx *)0x0) {
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(tmp_buf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,0x672);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
        logger::warn<>((CfdSourceLocation *)&tmp_buf,"global tx duplicates.");
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&tmp_buf,"psbt global tx duplicates error.",(allocator *)&tmp_size);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ByteData::ByteData((ByteData *)&tmp_buf,&buf);
      Transaction::Transaction((Transaction *)&tmp_size,(ByteData *)&tmp_buf);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tmp_buf);
      uVar4 = Transaction::GetTxInCount((Transaction *)&tmp_size);
      if (uVar4 != 0) {
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(tmp_buf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,0x67a);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
        logger::warn<>((CfdSourceLocation *)&tmp_buf,"psbt format error.");
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)&tmp_buf,"psbt format error.",(allocator *)&tx);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      Transaction::GetTxOutList(&txouts,(Transaction *)&tmp_size);
      tx.outputs = (wally_tx_output *)0x0;
      tx.num_outputs = 0;
      tx.num_inputs = 0;
      tx.inputs_allocation_len = 0;
      tx.version = 0;
      tx.locktime = 0;
      tx.inputs = (wally_tx_input *)0x0;
      tx.outputs_allocation_len = 0;
      uVar4 = AbstractTransaction::GetVersion((AbstractTransaction *)&tmp_size);
      tx.version = uVar4;
      uVar4 = AbstractTransaction::GetLockTime((AbstractTransaction *)&tmp_size);
      tx.locktime = uVar4;
      ret = wally_psbt_set_global_tx(psbt,&tx);
      if (ret != 0) {
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(tmp_buf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,0x684);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
        logger::warn<int&>((CfdSourceLocation *)&tmp_buf,"wally_psbt_set_global_tx NG[{}]",&ret);
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&tmp_buf,"psbt set tx error.",(allocator *)local_100);
        CfdException::CfdException(pCVar5,kCfdInternalError,(string *)&tmp_buf);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      index = 0;
      ret = 0;
      while( true ) {
        pTVar2 = txouts.
                 super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = (ulong)index;
        if ((ulong)(((long)txouts.
                           super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)txouts.
                          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x50) <= uVar7) break;
        Script::Script((Script *)&tmp_buf,
                       &txouts.
                        super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7].
                        super_AbstractTxOutReference.locking_script_);
        Script::GetData((ByteData *)local_100,(Script *)&tmp_buf);
        ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &script_val.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                           (ByteData *)local_100);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_100);
        Script::~Script((Script *)&tmp_buf);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_100 = (undefined1  [8])pTVar2[uVar7].super_AbstractTxOutReference.value_.amount_;
        local_f8 = CONCAT31(local_f8._1_3_,
                            pTVar2[uVar7].super_AbstractTxOutReference.value_.ignore_check_);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)Amount::GetSatoshiValue((Amount *)local_100);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ret = wally_psbt_add_output_at(psbt,index,0,(wally_tx_output *)&tmp_buf);
        if (ret != 0) {
          local_100 = (undefined1  [8])0x4f1c8e;
          local_f8 = 0x692;
          local_f0 = "ParsePsbtData";
          logger::warn<int&>((CfdSourceLocation *)local_100,"wally_psbt_add_output_at NG[{}]",&ret);
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string((string *)local_100,"psbt set txout error.",&local_1e9);
          CfdException::CfdException(pCVar5,kCfdInternalError,(string *)local_100);
          __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        index = index + 1;
      }
      ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
                (&txouts);
      Transaction::~Transaction((Transaction *)&tmp_size);
    }
    else {
      ret = wally_map_add(&psbt->unknowns,
                          key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,key_len,
                          buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)buf.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)buf.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      if (ret != 0) {
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(tmp_buf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,0x6b1);
        tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
        logger::warn<int&>((CfdSourceLocation *)&tmp_buf,"wally_map_add NG[{}]",&ret);
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&tmp_buf,"psbt add unknowns error.",(allocator *)&tmp_size);
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  } while (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start !=
           key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish);
  if (psbt->tx == (wally_tx *)0x0) {
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x6ba);
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
    logger::warn<>((CfdSourceLocation *)&tmp_buf,"psbt global tx not found.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tmp_buf,"psbt global tx not found error.",(allocator *)&tmp_size);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = wally_map_sort(&psbt->unknowns,0);
  if (ret != 0) {
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x6c1);
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
    logger::warn<int&>((CfdSourceLocation *)&tmp_buf,"wally_map_sort NG[{}]",&ret);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&tmp_buf,"psbt sort unknowns error.",(allocator *)&tmp_size);
    CfdException::CfdException(pCVar5,kCfdInternalError,(string *)&tmp_buf);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pwVar6 = psbt->tx;
  if (pwVar6->num_inputs != 0) {
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x6c6);
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
    logger::warn<>((CfdSourceLocation *)&tmp_buf,"psbt exist input. please use libwally-core.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&tmp_buf,"psbt exist input.",(allocator *)&tmp_size);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = 0;
  for (uVar7 = 0; uVar7 < pwVar6->num_outputs; uVar7 = uVar7 + 1) {
    output = psbt->outputs + uVar7;
    tmp_size = 0;
    pvStack_150 = (void *)0x0;
    local_148 = (pointer)0x0;
    do {
      Deserializer::ReadVariableBuffer
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,&parser)
      ;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tmp_size);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if ((void *)tmp_size == pvStack_150) break;
      Deserializer::ReadVariableBuffer
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,&parser)
      ;
      SetPsbtOutput((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tmp_size,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                    output);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    } while ((void *)tmp_size != pvStack_150);
    uVar4 = wally_map_sort(&output->keypaths,0);
    tx.version = uVar4;
    if (uVar4 != 0) {
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(tmp_buf.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish._4_4_,0x62b);
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "ParsePsbtOutput";
      logger::warn<int&>((CfdSourceLocation *)&tmp_buf,"wally_map_sort NG[{}]",(int *)&tx);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tmp_buf,"psbt output sort keypaths error.",(allocator *)local_100);
      CfdException::CfdException(pCVar5,kCfdInternalError,(string *)&tmp_buf);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    tx.version = wally_map_sort(&output->unknowns,0);
    if (tx.version != 0) {
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(tmp_buf.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish._4_4_,0x631);
      tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "ParsePsbtOutput";
      logger::warn<int&>((CfdSourceLocation *)&tmp_buf,"wally_map_sort NG[{}]",(int *)&tx);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tmp_buf,"psbt output sort unknowns error.",(allocator *)local_100);
      CfdException::CfdException(pCVar5,kCfdInternalError,(string *)&tmp_buf);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tmp_size);
    pwVar6 = psbt->tx;
  }
  uVar4 = Deserializer::GetReadSize(&parser);
  pwVar8 = psbt;
  if ((long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ulong)uVar4) {
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x6d0);
    tmp_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "ParsePsbtData";
    logger::warn<>((CfdSourceLocation *)&tmp_buf,"psbt analyze error.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&tmp_buf,"psbt analyze error.",(allocator *)&tmp_size);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tmp_buf);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  Deserializer::~Deserializer(&parser);
  iVar3 = ret;
LAB_002dc218:
  ret = iVar3;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return pwVar8;
}

Assistant:

struct wally_psbt *ParsePsbtData(const ByteData &data) {
  static const uint8_t kPsbtMagic[] = {'p', 's', 'b', 't', 0xff};

  struct wally_psbt *psbt = nullptr;
  std::vector<uint8_t> bytes = data.GetBytes();
  int ret = wally_psbt_from_bytes(bytes.data(), bytes.size(), &psbt);
  if (ret == WALLY_OK) {
    if ((psbt->num_inputs != 0) || (psbt->num_outputs != 0)) {
      return psbt;
    }
    std::vector<uint8_t> tmp_buf(bytes.size());
    size_t tmp_size = 0;
    ret = wally_psbt_to_bytes(
        psbt, 0, tmp_buf.data(), tmp_buf.size(), &tmp_size);
    if ((ret == WALLY_OK) && (tmp_size == bytes.size())) {
      // It was able to convert the data correctly.
      return psbt;
    }
    wally_psbt_free(psbt);
    psbt = nullptr;
  } else if (ret != WALLY_EINVAL) {
    warn(CFD_LOG_SOURCE, "wally_psbt_from_bytes NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt from bytes error.");
  }

  Deserializer parser(data);
  uint8_t magic[sizeof(kPsbtMagic)];
  memset(magic, 0, sizeof(magic));
  if (bytes.size() > 5) parser.ReadArray(magic, sizeof(magic));
  if (memcmp(magic, kPsbtMagic, sizeof(magic)) != 0) {
    warn(CFD_LOG_SOURCE, "psbt unmatch magic.");
    throw CfdException(kCfdInternalError, "psbt unmatch magic error.");
  }
  ret = wally_psbt_init_alloc(0, 0, 0, 0, &psbt);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_init_alloc NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt alloc error.");
  }

  try {
    memcpy(psbt->magic, magic, sizeof(psbt->magic));

    std::vector<uint8_t> key;
    do {
      key = parser.ReadVariableBuffer();
      if (!key.empty()) {
        std::vector<uint8_t> buf = parser.ReadVariableBuffer();
        bool has_key_1byte = (key.size() == 1);
        if (key[0] == Psbt::kPsbtGlobalUnsignedTx) {
          if (!has_key_1byte) {
            warn(CFD_LOG_SOURCE, "psbt invalid key format.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt invalid key format error.");
          }
          if (psbt->tx != nullptr) {
            warn(CFD_LOG_SOURCE, "global tx duplicates.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt global tx duplicates error.");
          }

          Transaction transaction(buf);
          if (transaction.GetTxInCount() != 0) {
            // failed to psbt format check on libwally-core.
            warn(CFD_LOG_SOURCE, "psbt format error.");
            throw CfdException(kCfdIllegalArgumentError, "psbt format error.");
          }
          auto txouts = transaction.GetTxOutList();
          struct wally_tx tx;
          memset(&tx, 0, sizeof(tx));
          tx.version = transaction.GetVersion();
          tx.locktime = transaction.GetLockTime();
          ret = wally_psbt_set_global_tx(psbt, &tx);
          if (ret != WALLY_OK) {
            warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
            throw CfdException(kCfdInternalError, "psbt set tx error.");
          }
          for (uint32_t index = 0; index < txouts.size(); ++index) {
            const auto &txout = txouts[index];
            auto script_val = txout.GetLockingScript().GetData().GetBytes();
            struct wally_tx_output output;
            memset(&output, 0, sizeof(output));
            output.satoshi =
                static_cast<uint64_t>(txout.GetValue().GetSatoshiValue());
            output.script = script_val.data();
            output.script_len = script_val.size();
            ret = wally_psbt_add_output_at(psbt, index, 0, &output);
            if (ret != WALLY_OK) {
              warn(CFD_LOG_SOURCE, "wally_psbt_add_output_at NG[{}]", ret);
              throw CfdException(kCfdInternalError, "psbt set txout error.");
            }
          }
        } else if (key[0] == Psbt::kPsbtGlobalVersion) {
          if (!has_key_1byte) {
            warn(CFD_LOG_SOURCE, "psbt invalid key format.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt invalid key format error.");
          }
          if (psbt->version > 0) {
            warn(CFD_LOG_SOURCE, "psbt version duplicates.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt version duplicates error.");
          }
          if (buf.size() != sizeof(psbt->version)) {
            warn(CFD_LOG_SOURCE, "psbt invlid version size.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt invlid version size error.");
          }
          memcpy(&psbt->version, buf.data(), sizeof(psbt->version));
          if (psbt->version > Psbt::GetDefaultVersion()) {
            warn(
                CFD_LOG_SOURCE, "psbt unsupported version[{}]", psbt->version);
            throw CfdException(
                kCfdIllegalArgumentError, "psbt unsupported version error.");
          }
        } else {
          ret = wally_map_add(
              &psbt->unknowns, key.data(), key.size(), buf.data(), buf.size());
          if (ret != WALLY_OK) {
            warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
            throw CfdException(
                kCfdIllegalArgumentError, "psbt add unknowns error.");
          }
        }
      }
    } while (!key.empty());

    if (psbt->tx == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt global tx not found.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt global tx not found error.");
    }

    ret = wally_map_sort(&psbt->unknowns, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt sort unknowns error.");
    }

    if (psbt->tx->num_inputs != 0) {
      warn(CFD_LOG_SOURCE, "psbt exist input. please use libwally-core.");
      throw CfdException(kCfdIllegalArgumentError, "psbt exist input.");
    }

    for (size_t i = 0; i < psbt->tx->num_outputs; ++i) {
      ParsePsbtOutput(&parser, &psbt->outputs[i]);
    }

    uint32_t offset = parser.GetReadSize();
    if (bytes.size() != offset) {
      warn(CFD_LOG_SOURCE, "psbt analyze error.");
      throw CfdException(kCfdIllegalArgumentError, "psbt analyze error.");
    }
    return psbt;
  } catch (const CfdError &except) {
    wally_psbt_free(psbt);
    throw except;
  } catch (const std::exception &except) {
    wally_psbt_free(psbt);
    warn(CFD_LOG_SOURCE, "unknown exception.");
    throw CfdException(kCfdUnknownError, std::string(except.what()));
  } catch (...) {
    wally_psbt_free(psbt);
    warn(CFD_LOG_SOURCE, "unknown error.");
    throw CfdException();
  }
}